

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 in_RAX;
  SingleVertexArrayOffsetGroup *this_00;
  undefined8 extraout_RAX;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 4) {
    this_00 = (SingleVertexArrayOffsetGroup *)operator_new(0x80);
    SingleVertexArrayOffsetGroup::SingleVertexArrayOffsetGroup
              (this_00,(this->super_TestCaseGroup).m_context,
               *(InputType *)((long)&DAT_0184486c + lVar1));
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test offset with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayOffsetGroup(m_context, inputTypes[inputTypeNdx]));
	}
}